

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

bool testing::internal::BoolFromGTestEnv(char *flag,bool default_value)

{
  int iVar1;
  char *__s1;
  char *in_RDX;
  string env_var;
  string local_30;
  
  FlagToEnvVar_abi_cxx11_(&local_30,(internal *)flag,in_RDX);
  __s1 = getenv(local_30._M_dataplus._M_p);
  if (__s1 != (char *)0x0) {
    iVar1 = strcmp(__s1,"0");
    default_value = iVar1 != 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return default_value;
}

Assistant:

bool BoolFromGTestEnv(const char* flag, bool default_value) {
#if defined(GTEST_GET_BOOL_FROM_ENV_)
  return GTEST_GET_BOOL_FROM_ENV_(flag, default_value);
#else
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  return string_value == nullptr ? default_value
                                 : strcmp(string_value, "0") != 0;
#endif  // defined(GTEST_GET_BOOL_FROM_ENV_)
}